

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::CommandDiagGetQuery
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aAddr,uint64_t aDiagDataFlags
          )

{
  undefined1 auStack_38 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  (*((this->mCommissioner).
     super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Commissioner[0x37])(auStack_38);
  Error::operator=(__return_storage_ptr__,(Error *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::CommandDiagGetQuery(const std::string &aAddr, uint64_t aDiagDataFlags)
{
    Error error;

    error = mCommissioner->CommandDiagGetQuery(aAddr, aDiagDataFlags);
    return error;
}